

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.hpp
# Opt level: O3

void __thiscall
boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::
initialize(queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_> *this)

{
  size_t sVar1;
  size_t sVar2;
  node *pnVar3;
  index_t iVar4;
  node *pnVar5;
  uint uVar6;
  
  sVar1 = (this->pool).
          super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
          .node_count_;
  iVar4 = detail::
          fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
          ::allocate<true>(&this->pool);
  sVar2 = (this->pool).
          super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
          .node_count_;
  uVar6 = (uint)sVar2;
  if (iVar4 == (index_t)sVar2) {
    pnVar5 = (node *)0x0;
  }
  else {
    pnVar3 = (this->pool).
             super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
             .nodes_;
    pnVar5 = pnVar3 + iVar4;
    pnVar3[iVar4].next._M_i = (tagged_index)((uint)sVar1 & 0xffff);
    uVar6 = (uint)(this->pool).
                  super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
                  .node_count_;
  }
  if (pnVar5 != (node *)0x0) {
    uVar6 = (uint)((int)pnVar5 -
                  *(int *)&(this->pool).
                           super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
                           .nodes_) >> 6;
  }
  (this->head_)._M_i = (tagged_index)(uVar6 & 0xffff);
  (this->tail_)._M_i = (tagged_index)(uVar6 & 0xffff);
  return;
}

Assistant:

void initialize(void)
    {
        node * n = pool.template construct<true, false>(pool.null_handle());
        tagged_node_handle dummy_node(pool.get_handle(n), 0);
        head_.store(dummy_node, memory_order_relaxed);
        tail_.store(dummy_node, memory_order_release);
    }